

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O2

void __thiscall Encode::quickSortProbability(Encode *this,int L,int R)

{
  double dVar1;
  double dVar2;
  char cVar3;
  pointer pdVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int R_00;
  int iVar10;
  long lVar11;
  int iVar12;
  double __tmp;
  
  do {
    dVar1 = (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(L + R) / 2];
    R_00 = R;
    iVar10 = L;
    while (iVar10 <= R_00) {
      pdVar4 = (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)iVar10 + -1;
      do {
        iVar8 = iVar10;
        dVar2 = pdVar4[lVar7 + 1];
        lVar7 = lVar7 + 1;
        iVar9 = iVar8 + 1;
        iVar10 = iVar9;
      } while (dVar1 < dVar2);
      lVar11 = (long)R_00 + 1;
      do {
        iVar10 = R_00;
        lVar6 = lVar11 + -1;
        lVar11 = lVar11 + -1;
        iVar12 = iVar10 + -1;
        R_00 = iVar12;
      } while (pdVar4[lVar6] < dVar1);
      R_00 = iVar10;
      iVar10 = iVar8;
      if (lVar7 <= lVar11) {
        pdVar4[lVar7] = pdVar4[lVar6];
        pdVar4[lVar11] = dVar2;
        pcVar5 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        cVar3 = pcVar5[lVar7];
        pcVar5[lVar7] = pcVar5[lVar11];
        pcVar5[lVar11] = cVar3;
        R_00 = iVar12;
        iVar10 = iVar9;
      }
    }
    if (L < R_00) {
      quickSortProbability(this,L,R_00);
    }
    L = iVar10;
  } while (iVar10 < R);
  return;
}

Assistant:

void quickSortProbability(int L, int R) {
        int i = L;
        int j = R;
        double temp = m_probabilities[(i + j) / 2];
        while (i <= j) {
            while (m_probabilities[i] > temp) {
                i++;
            }
            while (m_probabilities[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_probabilities[i], m_probabilities[j]);
                swap(m_data[i], m_data[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSortProbability(L, j);
        }
        if (i < R) {
            quickSortProbability(i, R);
        }
    }